

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void testing::internal::JsonUnitTestResultPrinter::OutputJsonTestResult
               (ostream *stream,TestResult *result)

{
  bool bVar1;
  int line;
  uint uVar2;
  TestPartResult *this;
  ostream *poVar3;
  internal *this_00;
  char *__rhs;
  size_t in_RDX;
  size_t width;
  string local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  undefined1 local_98 [8];
  string message;
  string location;
  TestPartResult *part;
  int i;
  int failures;
  string kIndent;
  TestResult *result_local;
  ostream *stream_local;
  
  kIndent.field_2._8_8_ = result;
  Indent_abi_cxx11_((string *)&i,(internal *)0xa,in_RDX);
  part._4_4_ = 0;
  for (part._0_4_ = 0; line = TestResult::total_part_count((TestResult *)kIndent.field_2._8_8_),
      (int)part < line; part._0_4_ = (int)part + 1) {
    this = TestResult::GetTestPartResult((TestResult *)kIndent.field_2._8_8_,(int)part);
    bVar1 = TestPartResult::failed(this);
    if (bVar1) {
      std::operator<<(stream,",\n");
      part._4_4_ = part._4_4_ + 1;
      if (part._4_4_ == 1) {
        poVar3 = std::operator<<(stream,(string *)&i);
        poVar3 = std::operator<<(poVar3,"\"");
        poVar3 = std::operator<<(poVar3,"failures");
        std::operator<<(poVar3,"\": [\n");
      }
      this_00 = (internal *)TestPartResult::file_name(this);
      uVar2 = TestPartResult::line_number(this);
      FormatCompilerIndependentFileLocation_abi_cxx11_
                ((string *)((long)&message.field_2 + 8),this_00,(char *)(ulong)uVar2,line);
      std::operator+(&local_d8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&message.field_2 + 8),"\n");
      __rhs = TestPartResult::message(this);
      std::operator+(&local_b8,&local_d8,__rhs);
      EscapeJson((string *)local_98,&local_b8);
      std::__cxx11::string::~string((string *)&local_b8);
      std::__cxx11::string::~string((string *)&local_d8);
      poVar3 = std::operator<<(stream,(string *)&i);
      poVar3 = std::operator<<(poVar3,"  {\n");
      poVar3 = std::operator<<(poVar3,(string *)&i);
      poVar3 = std::operator<<(poVar3,"    \"failure\": \"");
      poVar3 = std::operator<<(poVar3,(string *)local_98);
      poVar3 = std::operator<<(poVar3,"\",\n");
      poVar3 = std::operator<<(poVar3,(string *)&i);
      poVar3 = std::operator<<(poVar3,"    \"type\": \"\"\n");
      poVar3 = std::operator<<(poVar3,(string *)&i);
      std::operator<<(poVar3,"  }");
      std::__cxx11::string::~string((string *)local_98);
      std::__cxx11::string::~string((string *)(message.field_2._M_local_buf + 8));
    }
  }
  if (0 < part._4_4_) {
    poVar3 = std::operator<<(stream,"\n");
    poVar3 = std::operator<<(poVar3,(string *)&i);
    std::operator<<(poVar3,"]");
  }
  poVar3 = std::operator<<(stream,"\n");
  Indent_abi_cxx11_(&local_f8,(internal *)0x8,width);
  poVar3 = std::operator<<(poVar3,(string *)&local_f8);
  std::operator<<(poVar3,"}");
  std::__cxx11::string::~string((string *)&local_f8);
  std::__cxx11::string::~string((string *)&i);
  return;
}

Assistant:

void JsonUnitTestResultPrinter::OutputJsonTestResult(::std::ostream* stream,
                                                     const TestResult& result) {
  const std::string kIndent = Indent(10);

  int failures = 0;
  for (int i = 0; i < result.total_part_count(); ++i) {
    const TestPartResult& part = result.GetTestPartResult(i);
    if (part.failed()) {
      *stream << ",\n";
      if (++failures == 1) {
        *stream << kIndent << "\""
                << "failures"
                << "\": [\n";
      }
      const std::string location =
          internal::FormatCompilerIndependentFileLocation(part.file_name(),
                                                          part.line_number());
      const std::string message = EscapeJson(location + "\n" + part.message());
      *stream << kIndent << "  {\n"
              << kIndent << "    \"failure\": \"" << message << "\",\n"
              << kIndent << "    \"type\": \"\"\n"
              << kIndent << "  }";
    }
  }

  if (failures > 0) *stream << "\n" << kIndent << "]";
  *stream << "\n" << Indent(8) << "}";
}